

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O2

int __thiscall bdQuery::addClosestPeer(bdQuery *this,bdId *id,uint32_t mode)

{
  multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  uint *puVar2;
  in_port_t iVar3;
  in_addr iVar4;
  int iVar5;
  _Self __tmp;
  _Base_ptr p_Var6;
  iterator iVar7;
  iterator iVar8;
  _Rb_tree_node_base *p_Var9;
  long lVar10;
  _Self __tmp_2;
  _Self __tmp_1;
  bdPeer *pbVar11;
  bdPeer *pbVar12;
  int iVar13;
  int iVar14;
  byte bVar15;
  bdMetric dist;
  bdPeer local_e8;
  pair<bdMetric,_bdPeer> local_98;
  
  bVar15 = 0;
  iVar13 = 0;
  p_Var6 = (_Base_ptr)time((time_t *)0x0);
  (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,this,&id->id,&dist);
  this_00 = &this->mClosest;
  iVar7 = std::
          _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
          ::lower_bound(&this_00->_M_t,&dist);
  iVar8 = std::
          _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
          ::upper_bound(&this_00->_M_t,&dist);
  p_Var9 = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar14 = 0;
  while (p_Var9 != iVar8._M_node) {
    lVar10 = *(long *)(p_Var9 + 3);
    if ((lVar10 != 0) && (10 < (long)p_Var6 - lVar10 && (long)p_Var9[3]._M_parent < lVar10)) {
      iVar14 = iVar14 + -1;
      iVar13 = iVar13 + 1;
    }
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    iVar14 = iVar14 + 1;
  }
  iVar5 = 0;
  if (iVar14 < this->mClosestListSize) {
    for (; iVar7._M_node != iVar8._M_node;
        iVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar7._M_node)) {
      iVar14 = (*this->mFns->_vptr_bdDhtFunctions[7])(this->mFns,id,&iVar7._M_node[1]._M_right);
      if ((char)iVar14 != '\0') {
        if (mode == 0) {
          return 1;
        }
        iVar13 = (*this->mFns->_vptr_bdDhtFunctions[8])(this->mFns,&iVar7._M_node[1]._M_right,id);
        if ((char)iVar13 != '\0') {
          *(byte *)&iVar7._M_node[3]._M_right = *(byte *)&iVar7._M_node[3]._M_right | 1;
        }
        if ((mode & 4) == 0) {
          return 1;
        }
        iVar7._M_node[3]._M_parent = p_Var6;
        puVar2 = (uint *)((long)&iVar7._M_node[2]._M_right + 4);
        *puVar2 = *puVar2 | mode;
        return 1;
      }
    }
    p_Var1 = &(this->mClosest)._M_t._M_impl.super__Rb_tree_header;
    iVar14 = 0;
    if (iVar13 < 1) {
      iVar13 = 0;
    }
    for (; iVar14 != iVar13; iVar14 = iVar14 + 1) {
      for (iVar7._M_node = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)iVar7._M_node != p_Var1;
          iVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar7._M_node)) {
        lVar10 = *(long *)(iVar7._M_node + 3);
        if ((lVar10 != 0) &&
           (10 < (long)p_Var6 - lVar10 && (long)iVar7._M_node[3]._M_parent < lVar10)) {
          std::
          _Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
          ::erase_abi_cxx11_((_Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                              *)this_00,iVar7);
          break;
        }
      }
    }
    while ((ulong)(this->mClosestListSize - 1) <
           (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      iVar7._M_node = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
      std::
      _Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
      ::erase_abi_cxx11_((_Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                          *)this_00,iVar7);
    }
    bdPeer::bdPeer(&local_e8);
    local_e8.mPeerId.id.data._16_4_ = *(undefined4 *)((id->id).data + 0x10);
    local_e8.mPeerId.id.data._0_8_ = *(undefined8 *)(id->id).data;
    local_e8.mPeerId.id.data._8_8_ = *(undefined8 *)((id->id).data + 8);
    local_e8.mPeerId.addr.sin_family = (id->addr).sin_family;
    local_e8.mPeerId.addr.sin_port = (id->addr).sin_port;
    local_e8.mPeerId.addr.sin_addr.s_addr = (id->addr).sin_addr.s_addr;
    local_e8.mPeerId.addr.sin_zero = *&(id->addr).sin_zero;
    local_e8.mPeerFlags = mode;
    local_e8.mLastSendTime = 0;
    local_e8.mLastRecvTime = 0;
    local_e8.mFoundTime = (time_t)p_Var6;
    if ((mode & 4) != 0) {
      local_e8.mLastRecvTime = (time_t)p_Var6;
    }
    local_98.first.super_bdNodeId.data[0x10] = dist.super_bdNodeId.data[0x10];
    local_98.first.super_bdNodeId.data[0x11] = dist.super_bdNodeId.data[0x11];
    local_98.first.super_bdNodeId.data[0x12] = dist.super_bdNodeId.data[0x12];
    local_98.first.super_bdNodeId.data[0x13] = dist.super_bdNodeId.data[0x13];
    local_98.first.super_bdNodeId.data[0] = dist.super_bdNodeId.data[0];
    local_98.first.super_bdNodeId.data[1] = dist.super_bdNodeId.data[1];
    local_98.first.super_bdNodeId.data[2] = dist.super_bdNodeId.data[2];
    local_98.first.super_bdNodeId.data[3] = dist.super_bdNodeId.data[3];
    local_98.first.super_bdNodeId.data[4] = dist.super_bdNodeId.data[4];
    local_98.first.super_bdNodeId.data[5] = dist.super_bdNodeId.data[5];
    local_98.first.super_bdNodeId.data[6] = dist.super_bdNodeId.data[6];
    local_98.first.super_bdNodeId.data[7] = dist.super_bdNodeId.data[7];
    local_98.first.super_bdNodeId.data[8] = dist.super_bdNodeId.data[8];
    local_98.first.super_bdNodeId.data[9] = dist.super_bdNodeId.data[9];
    local_98.first.super_bdNodeId.data[10] = dist.super_bdNodeId.data[10];
    local_98.first.super_bdNodeId.data[0xb] = dist.super_bdNodeId.data[0xb];
    local_98.first.super_bdNodeId.data[0xc] = dist.super_bdNodeId.data[0xc];
    local_98.first.super_bdNodeId.data[0xd] = dist.super_bdNodeId.data[0xd];
    local_98.first.super_bdNodeId.data[0xe] = dist.super_bdNodeId.data[0xe];
    local_98.first.super_bdNodeId.data[0xf] = dist.super_bdNodeId.data[0xf];
    pbVar11 = &local_e8;
    pbVar12 = &local_98.second;
    for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
      iVar3 = (pbVar11->mPeerId).addr.sin_port;
      iVar4.s_addr = (pbVar11->mPeerId).addr.sin_addr.s_addr;
      (pbVar12->mPeerId).addr.sin_family = (pbVar11->mPeerId).addr.sin_family;
      (pbVar12->mPeerId).addr.sin_port = iVar3;
      (pbVar12->mPeerId).addr.sin_addr = (in_addr)iVar4.s_addr;
      pbVar11 = (bdPeer *)((long)pbVar11 + ((ulong)bVar15 * -2 + 1) * 8);
      pbVar12 = (bdPeer *)((long)pbVar12 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    std::
    _Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
    ::_M_emplace_equal<std::pair<bdMetric,bdPeer>>
              ((_Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                *)this_00,&local_98);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int bdQuery::addClosestPeer(const bdId *id, uint32_t mode) {
	bdMetric dist;
	time_t ts = time(NULL);

	mFns->bdDistance(&mId, &(id->id), &dist);

#ifdef DEBUG_QUERY 
        fprintf(stderr, "bdQuery::addPeer(");
	mFns->bdPrintId(std::cerr, id);
        fprintf(stderr, ", %u)\n", mode);
#endif

	std::multimap<bdMetric, bdPeer>::iterator it, sit, eit;
	sit = mClosest.lower_bound(dist);
	eit = mClosest.upper_bound(dist);
	int i = 0;
	int actualCloser = 0;
	int toDrop = 0;
	// switched end condition to upper_bound to provide stability for NATTED peers.
	// we will favour the older entries!
	for (it = mClosest.begin(); it != eit; it++, i++, actualCloser++) {
		time_t sendts = ts - it->second.mLastSendTime;
		bool hasSent = (it->second.mLastSendTime != 0);
		bool hasReply = (it->second.mLastRecvTime >= it->second.mLastSendTime);
		if ((hasSent) && (!hasReply) && (sendts > EXPECTED_REPLY)) {
			i--; /* dont count this one */
			toDrop++;
		}
	}
		// Counts where we are.
#ifdef DEBUG_QUERY 
        fprintf(stderr, "Searching.... %di = %d - %d peers closer than this one\n", i, actualCloser, toDrop);
#endif


	if (i > mClosestListSize - 1) {
#ifdef DEBUG_QUERY 
        	fprintf(stderr, "Distance to far... dropping\n");
#endif
		/* drop it */
		return 0;
	}

	for (it = sit; it != eit; it++, i++) {
		/* full id check */
		if (mFns->bdSimilarId(id, &(it->second.mPeerId))) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "Peer Already here!\n");
#endif
			if (mode) {
				/* also update port from incoming id, as we have definitely recved from it */
				if (mFns->bdUpdateSimilarId(&(it->second.mPeerId), id))
					/* updated it... must be Unstable */
					it->second.mExtraFlags |= BITDHT_PEER_EXFLAG_UNSTABLE;
			}
			if (mode & BITDHT_PEER_STATUS_RECV_NODES) {
				/* only update recvTime if sendTime > checkTime.... (then its our query) */
#ifdef DEBUG_QUERY 
				fprintf(stderr, "Updating LastRecvTime\n");
#endif
				it->second.mLastRecvTime = ts;
				it->second.mPeerFlags |= mode;
			}
			return 1;
		}
	}

#ifdef DEBUG_QUERY 
        fprintf(stderr, "Peer not in Query\n");
#endif
	/* firstly drop unresponded (bit ugly - but hard structure to extract from) */
	for (int j = 0; j < toDrop; j++) {
#ifdef DEBUG_QUERY 
        	fprintf(stderr, "Dropping Peer that dont reply\n");
#endif
		for (it = mClosest.begin(); it != mClosest.end(); ++it) {
			time_t sendts = ts - it->second.mLastSendTime;
			bool hasSent = (it->second.mLastSendTime != 0);
			bool hasReply = (it->second.mLastRecvTime >= it->second.mLastSendTime);

			if ((hasSent) && (!hasReply) && (sendts > EXPECTED_REPLY)) {
#ifdef DEBUG_QUERY 
        			fprintf(stderr, "Dropped: ");
				mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
        			fprintf(stderr, "\n");
#endif
				mClosest.erase(it);
				break ;
			}
		}
	}

	/* trim it back */
	while (mClosest.size() > (uint32_t) (mClosestListSize - 1)) {
		std::multimap<bdMetric, bdPeer>::iterator it;
		it = mClosest.end();
		if (!mClosest.empty()) {
			it--;
#ifdef DEBUG_QUERY 
			fprintf(stderr, "Removing Furthest Peer: ");
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			fprintf(stderr, "\n");
#endif

			mClosest.erase(it);
		}
	}

#ifdef DEBUG_QUERY 
        fprintf(stderr, "bdQuery::addPeer(): Closer Peer!: ");
	mFns->bdPrintId(std::cerr, id);
        fprintf(stderr, "\n");
#endif

	/* add it in */
	bdPeer peer;
	peer.mPeerId = *id;
	peer.mPeerFlags = mode;
	peer.mLastSendTime = 0;
	peer.mLastRecvTime = 0;
	peer.mFoundTime = ts;

	if (mode & BITDHT_PEER_STATUS_RECV_NODES)
		peer.mLastRecvTime = ts;

	mClosest.insert(std::pair<bdMetric, bdPeer>(dist, peer));
	return 1;
}